

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O0

void __thiscall OpenMD::StatWriter::writeMatrix(StatWriter *this,int i)

{
  uint uVar1;
  double *pdVar2;
  undefined8 uVar3;
  Stats *in_RDI;
  uint j1;
  uint i1;
  Mat3x3d s;
  ostream *in_stack_ffffffffffffff30;
  Stats *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 local_90 [144];
  
  Stats::getMatrixData(in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  local_90._52_4_ = 0;
  do {
    if (2 < (uint)local_90._52_4_) {
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x365607);
      return;
    }
    for (local_90._48_4_ = 0; (uint)local_90._48_4_ < 3; local_90._48_4_ = local_90._48_4_ + 1) {
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(local_90 + 0x38),local_90._52_4_,
                          local_90._48_4_);
      uVar1 = std::isinf(*pdVar2);
      if ((uVar1 & 1) == 0) {
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(local_90 + 0x38),local_90._52_4_,
                            local_90._48_4_);
        uVar1 = std::isnan(*pdVar2);
        if ((uVar1 & 1) != 0) goto LAB_003654fb;
        in_stack_ffffffffffffff30 = std::operator<<((ostream *)in_RDI,"\t");
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(local_90 + 0x38),local_90._52_4_,
                            local_90._48_4_);
        std::ostream::operator<<(in_stack_ffffffffffffff30,*pdVar2);
      }
      else {
LAB_003654fb:
        Stats::getTitle_abi_cxx11_
                  (in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        in_stack_ffffffffffffff38 = (Stats *)local_90;
        uVar3 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",uVar3);
        std::__cxx11::string::~string((string *)in_stack_ffffffffffffff38);
        painCave.isFatal = 1;
        simError();
      }
    }
    local_90._52_4_ = local_90._52_4_ + 1;
  } while( true );
}

Assistant:

void StatWriter::writeMatrix(int i) {
    Mat3x3d s = stats_->getMatrixData(i);

    for (unsigned int i1 = 0; i1 < 3; i1++) {
      for (unsigned int j1 = 0; j1 < 3; j1++) {
        if (std::isinf(s(i1, j1)) || std::isnan(s(i1, j1))) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "StatWriter detected a numerical error writing: %s",
                   stats_->getTitle(i).c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          statfile_ << "\t" << s(i1, j1);
        }
      }
    }
  }